

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O3

void Qentem::MemoryRecord::RemoveAllocation(void *pointer)

{
  MemoryRecordData *pMVar1;
  int iVar2;
  long lVar3;
  
  if (RemoveAllocation(void*)::storage == '\0') {
    iVar2 = __cxa_guard_acquire(&RemoveAllocation(void*)::storage);
    if (iVar2 != 0) {
      RemoveAllocation::storage = (MemoryRecordData *)getStorage()::data;
      __cxa_guard_release(&RemoveAllocation(void*)::storage);
    }
  }
  pMVar1 = RemoveAllocation::storage;
  RemoveAllocation::storage->deallocations = RemoveAllocation::storage->deallocations + 1;
  pMVar1->subDeallocations = pMVar1->subDeallocations + 1;
  lVar3 = malloc_usable_size(pointer);
  RemoveAllocation::storage->remainingSize = RemoveAllocation::storage->remainingSize - lVar3;
  return;
}

Assistant:

QENTEM_NOINLINE static void RemoveAllocation(void *pointer) noexcept {
        static MemoryRecordData &storage = getStorage();

        ++(storage.deallocations);
        ++(storage.subDeallocations);

#if defined(_WIN32) || defined(_M_X64)
        storage.remainingSize -= _msize(pointer);
#elif defined(__APPLE__)
        storage.remainingSize -= malloc_size(pointer);
#else
        storage.remainingSize -= malloc_usable_size(pointer);
#endif
    }